

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O3

bool __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::insert
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          value_type *value)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  locType *pos;
  node **p;
  int *pp;
  undefined4 extraout_var;
  long *plVar4;
  undefined4 extraout_var_01;
  ulong uVar5;
  int iVar6;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar7;
  long lVar8;
  long lVar9;
  locType *plVar10;
  ulong uVar11;
  node **ppnVar12;
  uint uVar13;
  ulong uVar14;
  pair<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  unsigned_long_long tmpk [100];
  long tmpv [100];
  locType local_688;
  int local_67c;
  ulong local_678;
  undefined1 local_670 [792];
  long local_358;
  undefined1 local_350 [800];
  node *pnVar3;
  undefined4 extraout_var_00;
  
  uVar5 = value->first;
  lVar7 = value->second;
  iVar2 = this->depth;
  lVar8 = (long)iVar2;
  if (lVar8 == 0) {
    iVar2 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
    this->root = extraout_RDX;
    this->depth = 1;
    *(undefined4 *)(plVar4 + 200) = 1;
    plVar4[0x65] = uVar5;
    *plVar4 = lVar7;
    plVar4[100] = -1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,&this->root);
    this->siz = 1;
    return true;
  }
  uVar14 = lVar8 * 8;
  if (iVar2 < 0) {
    uVar14 = 0xffffffffffffffff;
  }
  uVar11 = lVar8 * 4;
  if (iVar2 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pos = (locType *)operator_new__(uVar14);
  *pos = 0;
  p = (node **)operator_new__(uVar14);
  pp = (int *)operator_new__(uVar11);
  *pos = this->root;
  if (iVar2 < 1) {
    ppnVar12 = p + lVar8 + -1;
LAB_0010b392:
    pnVar3 = *ppnVar12;
    iVar6 = pnVar3->sz;
    uVar13 = 0;
  }
  else {
    lVar8 = 0;
    do {
      iVar2 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])(this->file,pos + lVar8);
      pnVar3 = (node *)CONCAT44(extraout_var,iVar2);
      p[lVar8] = pnVar3;
      uVar13 = pnVar3->sz;
      uVar14 = 0;
      if (0 < (long)(int)uVar13) {
        uVar14 = 0;
        do {
          if (uVar5 <= pnVar3->keyvalue[uVar14]) {
            iVar2 = this->depth;
            if ((long)iVar2 + -1 <= lVar8) goto LAB_0010b2a9;
            uVar14 = (ulong)(((int)uVar14 + 1) - (uint)(uVar5 < pnVar3->keyvalue[uVar14]));
            goto LAB_0010b29e;
          }
          uVar14 = uVar14 + 1;
        } while ((long)(int)uVar13 != uVar14);
        uVar14 = (ulong)uVar13;
      }
      iVar2 = this->depth;
      if (lVar8 < (long)iVar2 + -1) {
LAB_0010b29e:
        (pos + lVar8)[1] = (pnVar3->field_0).val[(int)uVar14];
      }
LAB_0010b2a9:
      uVar13 = (uint)uVar14;
      pp[lVar8] = uVar13;
      lVar8 = lVar8 + 1;
      lVar9 = (long)iVar2;
    } while (lVar8 < lVar9);
    pnVar3 = p[lVar9 + -1];
    iVar6 = pnVar3->sz;
    if (((int)uVar13 < iVar6) && (pnVar3->keyvalue[(int)uVar13] <= uVar5)) {
      operator_delete__(p);
      operator_delete__(pp);
      operator_delete__(pos);
      return false;
    }
    ppnVar12 = p + lVar9 + -1;
    if ((uVar13 == 0) && (uVar13 = 0, 1 < iVar2)) {
      plVar10 = pos + (iVar2 - 2);
      lVar8 = (ulong)(iVar2 - 2) + 1;
      do {
        lVar9 = (long)pp[lVar8 + -1];
        if ((lVar9 != 0) && (p[lVar8 + -1]->keyvalue[lVar9 + -1] == pnVar3->keyvalue[0])) {
          p[lVar8 + -1]->keyvalue[lVar9 + -1] = uVar5;
          (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[3])(this->file,plVar10);
          goto LAB_0010b392;
        }
        plVar10 = plVar10 + -1;
        lVar9 = lVar8 + -1;
        bVar1 = 0 < lVar8;
        lVar8 = lVar9;
      } while (lVar9 != 0 && bVar1);
    }
  }
  if (iVar6 < 99) {
    if ((int)uVar13 < iVar6) {
      lVar8 = (long)iVar6;
      do {
        pnVar3 = *ppnVar12;
        pnVar3->keyvalue[lVar8] = pnVar3->keyvalue[lVar8 + -1];
        (pnVar3->field_0).val[lVar8] = *(long *)((long)pnVar3 + lVar8 * 8 + -8);
        lVar8 = lVar8 + -1;
      } while ((int)uVar13 < lVar8);
      pnVar3 = *ppnVar12;
    }
    pnVar3->keyvalue[(int)uVar13] = uVar5;
    (pnVar3->field_0).val[(int)uVar13] = lVar7;
    (*ppnVar12)->sz = (*ppnVar12)->sz + 1;
    (*(this->file->
      super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
      )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
    goto LAB_0010b637;
  }
  iVar2 = (*(this->file->
            super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
            )._vptr_FileManager_Base[1])();
  lVar8 = CONCAT44(extraout_var_01,iVar2);
  pnVar3 = *ppnVar12;
  local_688 = extraout_RDX_00;
  if ((int)uVar13 < 1) {
    uVar14 = (ulong)(int)uVar13;
    *(long *)(local_350 + uVar14 * 8 + -8) = lVar7;
    *(ulong *)(local_670 + uVar14 * 8 + -8) = uVar5;
LAB_0010b4d0:
    __n = (ulong)(0x62 - uVar13) * 8 + 8;
    memcpy(local_350 + uVar14 * 8,(void *)((long)&pnVar3->field_0 + uVar14 * 8),__n);
    memcpy(local_670 + uVar14 * 8,pnVar3->keyvalue + uVar14,__n);
  }
  else {
    uVar14 = (ulong)uVar13;
    memcpy(&local_358,pnVar3,uVar14 * 8);
    memcpy(&local_678,pnVar3->keyvalue,uVar14 * 8);
    *(long *)(local_350 + uVar14 * 8 + -8) = lVar7;
    *(ulong *)(local_670 + uVar14 * 8 + -8) = uVar5;
    if (uVar13 < 99) goto LAB_0010b4d0;
  }
  *(locType *)(lVar8 + 800) = pnVar3->nxt;
  pnVar3->sz = 0x32;
  lVar7 = 0;
  do {
    (pnVar3->field_0).val[lVar7] = *(long *)(local_350 + lVar7 * 8 + -8);
    pnVar3 = *ppnVar12;
    pnVar3->keyvalue[lVar7] = *(unsigned_long_long *)(local_670 + lVar7 * 8 + -8);
    lVar7 = lVar7 + 1;
    uVar13 = pnVar3->sz;
    uVar5 = (ulong)uVar13;
    lVar9 = (long)(int)uVar13;
  } while (lVar7 < lVar9);
  pnVar3->nxt = extraout_RDX_00;
  if ((int)uVar13 < 100) {
    lVar7 = lVar8 + lVar9 * 8;
    do {
      *(undefined8 *)(lVar7 + (long)(int)uVar5 * -8) = *(undefined8 *)(local_350 + lVar9 * 8 + -8);
      uVar13 = (*ppnVar12)->sz;
      uVar5 = (ulong)(int)uVar13;
      *(undefined8 *)(lVar7 + 0x328 + uVar5 * -8) = *(undefined8 *)(local_670 + lVar9 * 8 + -8);
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 8;
    } while ((int)lVar9 != 100);
  }
  *(uint *)(lVar8 + 0x640) = 100 - uVar13;
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(this->file,&local_688);
  (*(this->file->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(this->file,pos + (long)this->depth + -1);
  local_67c = this->depth + -2;
  insertnonleaf(this,(unsigned_long_long *)(lVar8 + 0x328),&local_67c,p,pp,pos,local_688);
LAB_0010b637:
  operator_delete__(p);
  operator_delete__(pp);
  operator_delete__(pos);
  this->siz = this->siz + 1;
  return true;
}

Assistant:

bool insert(const value_type &value) {
            Key vkey = value.first;
            T vt = value.second;
            int i, j;
            if (!depth) {
                auto lnk = file->newspace();
                node *x = lnk.first;
                root = lnk.second;
                depth = 1;
                x->sz = 1;
                x->keyvalue[0] = vkey;
                x->val[0] = vt;
                x->nxt = -1;
                file->save(root);
                siz=1;
                return 1;
            }
            locType *pos;
            node **p;
            int *pp;
            pos = new locType[depth];
            memset(pos, 0, sizeof pos);
            p = new node *[depth];
            pp = new int[depth];
            pos[0] = root;
            for (i = 0; i < depth; ++i) {
                p[i] = file->read(pos[i]);
                for (j = 0; j < p[i]->sz && Compare()(p[i]->keyvalue[j], vkey); ++j);
                if (i < depth - 1) {
                    if (j < p[i]->sz && !Compare()(vkey, p[i]->keyvalue[j]))++j;
                    pos[i + 1] = p[i]->pointer[j];
                }
                pp[i] = j;
            }
            if (j < p[depth - 1]->sz && !Compare()(vkey, p[depth - 1]->keyvalue[j])) {
                delete[]p;
                delete[]pp;
                delete[]pos;
                return 0;
            }
            node *&x = p[depth - 1];
            if (!j) {
                for (i = depth - 2; i >= 0; --i)
                    if (pp[i] && equal(x->keyvalue[0], p[i]->keyvalue[pp[i] - 1])) {
                        p[i]->keyvalue[pp[i] - 1] = vkey;
                        file->save(pos[i]);
                        break;
                    }
            }
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->val[i] = x->val[i - 1];
                x->keyvalue[j] = vkey;
                x->val[j] = vt;
                ++x->sz;
                file->save(pos[depth - 1]);
            } else {
                T tmpv[degree];
                Key tmpk[degree];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = 0; i < j; ++i)tmpv[i] = x->val[i], tmpk[i] = x->keyvalue[i];
                tmpv[j] = vt;
                tmpk[j] = vkey;
                for (i = j + 1; i < degree; ++i)tmpv[i] = x->val[i - 1], tmpk[i] = x->keyvalue[i - 1];
                y->nxt = x->nxt;
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->val[i] = tmpv[i], x->keyvalue[i] = tmpk[i];
                x->nxt = lnk.second;
                for (i = x->sz; i < degree; ++i)y->val[i - x->sz] = tmpv[i], y->keyvalue[i - x->sz] = tmpk[i];
                y->sz = degree - x->sz;
                file->save(lnk.second);
                file->save(pos[depth - 1]);
                insertnonleaf(y->keyvalue[0], depth - 2, p, pp, pos, lnk.second);
            }
            delete[]p;
            delete[]pp;
            delete[]pos;
            ++siz;
            return 1;
        }